

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solution-graph.hxx
# Opt level: O0

void __thiscall
lineage::SolutionGraph::SolutionGraph
          (SolutionGraph *this,ProblemGraph *problemGraph,Solution *solution)

{
  value_type vVar1;
  ulong uVar2;
  ProblemGraph *this_00;
  bool bVar3;
  Problem *pPVar4;
  size_t sVar5;
  pointer pAVar6;
  const_reference pvVar7;
  Value VVar8;
  const_reference pvVar9;
  size_type sVar10;
  reference puVar11;
  Index number;
  reference pvVar12;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *pDVar13;
  Graph *vertexIndex1;
  Value __n;
  ProblemGraph *in_RDX;
  ProblemGraph *in_RSI;
  undefined8 *in_RDI;
  pair<std::_Rb_tree_const_iterator<unsigned_long>,_bool> pVar14;
  value_type c1;
  value_type c0;
  Value v1_1;
  AdjacencyIterator it_1;
  size_t v0_1;
  size_t j_1;
  size_t frame_1;
  size_t v;
  unsigned_long v1Component_1;
  unsigned_long v0Component_1;
  pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>
  *p;
  iterator __end3;
  iterator __begin3;
  map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  *__range3;
  Index v1Component;
  Value v1;
  AdjacencyIterator it;
  Index v0Component;
  size_t v0;
  size_t j;
  map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  descendants;
  size_t frame;
  ComponentLabeling componentsPerFrame;
  SubgraphCutPerFrame subgraphCutPerFrame;
  Solution *in_stack_00000458;
  ProblemGraph *in_stack_00000460;
  Graph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_fffffffffffffd28;
  ProblemGraph *in_stack_fffffffffffffd30;
  Visitor *in_stack_fffffffffffffd38;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_fffffffffffffd40;
  value_type_conflict1 *in_stack_fffffffffffffd48;
  Partition<unsigned_long> *in_stack_fffffffffffffd50;
  Graph *in_stack_fffffffffffffd58;
  Partition<unsigned_long> *in_stack_fffffffffffffd60;
  key_type *in_stack_fffffffffffffd68;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *this_01;
  map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
  *in_stack_fffffffffffffd70;
  Partition<unsigned_long> *in_stack_fffffffffffffda8;
  __normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
  out;
  undefined7 in_stack_fffffffffffffdc0;
  undefined1 in_stack_fffffffffffffdc7;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_160;
  size_t local_158;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *local_150;
  ulong local_148;
  ulong local_140;
  unsigned_long *local_138;
  _Base_ptr local_130;
  unsigned_long local_128;
  unsigned_long local_120;
  reference local_118;
  _Self local_110;
  _Self local_108;
  undefined1 *local_100;
  _Base_ptr local_f8;
  undefined1 local_f0;
  Index local_e8;
  size_type local_e0;
  Adjacency<unsigned_long> *local_d8;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_d0;
  Index local_c8;
  size_t local_c0;
  ulong local_b8;
  undefined1 local_b0 [48];
  ulong local_80;
  Partition<unsigned_long> local_78;
  SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_40;
  IdleGraphVisitor<unsigned_long> local_2d [21];
  ProblemGraph *local_18;
  ProblemGraph *local_10;
  
  *in_RDI = in_RSI;
  in_RDI[1] = in_RDX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pPVar4 = ProblemGraph::problem(in_RSI);
  std::vector<lineage::Node,_std::allocator<lineage::Node>_>::size(&pPVar4->nodes);
  std::allocator<unsigned_long>::allocator((allocator<unsigned_long> *)0x1382e4);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&in_stack_fffffffffffffd50->parents_,(size_type)in_stack_fffffffffffffd48,
             (allocator_type *)in_stack_fffffffffffffd40);
  std::allocator<unsigned_long>::~allocator((allocator<unsigned_long> *)0x138310);
  andres::graph::IdleGraphVisitor<unsigned_long>::IdleGraphVisitor(local_2d);
  andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Digraph
            (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)0x138363);
  validate(in_stack_00000460,in_stack_00000458);
  pPVar4 = problem((SolutionGraph *)0x138387);
  ProblemGraph::
  SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  ::SubgraphWithoutCutAndInterFrameEdges
            (&local_40,pPVar4,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_18);
  andres::graph::
  ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_>::
  ComponentsByPartition
            ((ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_>
              *)0x1383bd);
  ProblemGraph::graph(local_10);
  andres::graph::
  ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>>>::
  build<lineage::ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_>
              *)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58,
             (SubgraphWithoutCutAndInterFrameEdges<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              *)in_stack_fffffffffffffd50);
  for (local_80 = 0; uVar2 = local_80, sVar5 = ProblemGraph::numberOfFrames(local_10),
      uVar2 < sVar5 - 1; local_80 = local_80 + 1) {
    std::
    map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
    ::map((map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
           *)0x138452);
    for (local_b8 = 0; uVar2 = local_b8,
        sVar5 = ProblemGraph::numberOfNodesInFrame
                          (in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28),
        uVar2 < sVar5; local_b8 = local_b8 + 1) {
      local_c0 = ProblemGraph::nodeInFrame
                           (in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,0x1384c3);
      local_c8 = andres::Partition<unsigned_long>::find
                           (in_stack_fffffffffffffd50,(Index)in_stack_fffffffffffffd48);
      ProblemGraph::graph(local_10);
      local_d0._M_current =
           (Adjacency<unsigned_long> *)
           andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
           adjacenciesFromVertexBegin(in_stack_fffffffffffffd28,0x138538);
      while( true ) {
        ProblemGraph::graph(local_10);
        local_d8 = (Adjacency<unsigned_long> *)
                   andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
                   adjacenciesFromVertexEnd(in_stack_fffffffffffffd28,0x13857e);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                            *)in_stack_fffffffffffffd30,
                           (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                            *)in_stack_fffffffffffffd28);
        if (!bVar3) break;
        pAVar6 = __gnu_cxx::
                 __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                 ::operator->(&local_d0);
        local_e0 = andres::graph::Adjacency<unsigned_long>::vertex(pAVar6);
        pPVar4 = problem((SolutionGraph *)0x1385e0);
        pvVar7 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                           (&pPVar4->nodes,local_e0);
        this_00 = local_18;
        if ((long)pvVar7->t == local_80 + 1) {
          pAVar6 = __gnu_cxx::
                   __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                   ::operator->(&local_d0);
          VVar8 = andres::graph::Adjacency<unsigned_long>::edge(pAVar6);
          pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this_00,VVar8
                             );
          if (*pvVar9 == '\0') {
            local_e8 = andres::Partition<unsigned_long>::find
                                 (in_stack_fffffffffffffd50,(Index)in_stack_fffffffffffffd48);
            std::
            map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
            ::operator[](in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
            pVar14 = std::
                     set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                     insert((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                             *)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48);
            local_f8 = (_Base_ptr)pVar14.first._M_node;
            in_stack_fffffffffffffdc7 = pVar14.second;
            local_f0 = in_stack_fffffffffffffdc7;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
        ::operator++(&local_d0);
      }
    }
    local_100 = local_b0;
    local_108._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
         ::begin((map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                  *)in_stack_fffffffffffffd28);
    local_110._M_node =
         (_Base_ptr)
         std::
         map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
         ::end((map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
                *)in_stack_fffffffffffffd28);
    while (bVar3 = std::operator!=(&local_108,&local_110), bVar3) {
      local_118 = std::
                  _Rb_tree_iterator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                  ::operator*((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                               *)0x13881a);
      sVar10 = std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
               size((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_> *)
                    0x138833);
      if (sVar10 == 1) {
        local_120 = local_118->first;
        local_130 = (_Base_ptr)
                    std::
                    set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>::
                    begin((set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>
                           *)in_stack_fffffffffffffd28);
        puVar11 = std::_Rb_tree_const_iterator<unsigned_long>::operator*
                            ((_Rb_tree_const_iterator<unsigned_long> *)0x138872);
        local_128 = *puVar11;
        andres::Partition<unsigned_long>::merge
                  (in_stack_fffffffffffffd60,(Index)in_stack_fffffffffffffd58,
                   (Index)in_stack_fffffffffffffd50);
      }
      std::
      _Rb_tree_iterator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
      ::operator++((_Rb_tree_iterator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>
                    *)in_stack_fffffffffffffd30);
    }
    std::
    map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
    ::~map((map<unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::set<unsigned_long,_std::less<unsigned_long>,_std::allocator<unsigned_long>_>_>_>_>
            *)0x1388bf);
  }
  out._M_current = in_RDI + 5;
  number = andres::Partition<unsigned_long>::numberOfSets(&local_78);
  andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertVertices
            ((Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
             CONCAT17(in_stack_fffffffffffffdc7,in_stack_fffffffffffffdc0),number);
  local_138 = (unsigned_long *)
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::begin
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         in_stack_fffffffffffffd28);
  andres::Partition<unsigned_long>::
  elementLabeling<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>>
            (in_stack_fffffffffffffda8,out);
  numberOfCells((SolutionGraph *)0x138963);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::resize((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)in_stack_fffffffffffffd50,(size_type)in_stack_fffffffffffffd48);
  for (local_140 = 0; uVar2 = local_140, sVar5 = numberOfNodes((SolutionGraph *)0x1389a7),
      uVar2 < sVar5; local_140 = local_140 + 1) {
    pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                        ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 2),
                         local_140);
    std::
    vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
    ::operator[]((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                  *)(in_RDI + 0xc),*pvVar12);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)in_stack_fffffffffffffd40,
               (value_type_conflict1 *)in_stack_fffffffffffffd38);
  }
  for (local_148 = 0; uVar2 = local_148, sVar5 = ProblemGraph::numberOfFrames(local_10),
      uVar2 < sVar5 - 1; local_148 = local_148 + 1) {
    local_150 = (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)0x0;
    while (this_01 = local_150,
          pDVar13 = (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                    ProblemGraph::numberOfNodesInFrame
                              (in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28),
          this_01 < pDVar13) {
      sVar5 = ProblemGraph::nodeInFrame
                        (in_stack_fffffffffffffd30,(size_t)in_stack_fffffffffffffd28,0x138ac5);
      local_158 = sVar5;
      vertexIndex1 = ProblemGraph::graph(local_10);
      local_160._M_current =
           (Adjacency<unsigned_long> *)
           andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
           adjacenciesFromVertexBegin(in_stack_fffffffffffffd28,0x138aff);
      while( true ) {
        ProblemGraph::graph(local_10);
        andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
        adjacenciesFromVertexEnd(in_stack_fffffffffffffd28,0x138b39);
        bVar3 = __gnu_cxx::operator!=
                          ((__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                            *)in_stack_fffffffffffffd30,
                           (__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                            *)in_stack_fffffffffffffd28);
        if (!bVar3) break;
        pAVar6 = __gnu_cxx::
                 __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                 ::operator->(&local_160);
        VVar8 = andres::graph::Adjacency<unsigned_long>::vertex(pAVar6);
        pPVar4 = problem((SolutionGraph *)0x138b95);
        pvVar7 = std::vector<lineage::Node,_std::allocator<lineage::Node>_>::operator[]
                           (&pPVar4->nodes,VVar8);
        if ((long)pvVar7->t == local_148 + 1) {
          in_stack_fffffffffffffd30 = local_18;
          pAVar6 = __gnu_cxx::
                   __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                   ::operator->(&local_160);
          __n = andres::graph::Adjacency<unsigned_long>::edge(pAVar6);
          pvVar9 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                              in_stack_fffffffffffffd30,__n);
          if (*pvVar9 == '\0') {
            pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 (in_RDI + 2),local_158);
            vVar1 = *pvVar12;
            pvVar12 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                                 (in_RDI + 2),VVar8);
            if (vVar1 != *pvVar12) {
              andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::insertEdge
                        (this_01,sVar5,(size_t)vertexIndex1);
            }
          }
        }
        __gnu_cxx::
        __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
        ::operator++(&local_160);
      }
      local_150 = (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)
                  ((long)&(local_150->vertices_).
                          super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1);
    }
  }
  andres::graph::
  ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_>::
  ~ComponentsByPartition
            ((ComponentsByPartition<andres::graph::Graph<andres::graph::IdleGraphVisitor<unsigned_long>_>_>
              *)0x138cd9);
  return;
}

Assistant:

SolutionGraph(const ProblemGraph& problemGraph, const Solution& solution) :
        problemGraph_(problemGraph),
        solution_(solution),
        cellOfNode_(problemGraph.problem().nodes.size())
    {
        typedef andres::graph::ComponentsByPartition<Graph> ComponentLabeling;
        typedef ProblemGraph::SubgraphWithoutCutAndInterFrameEdges<Solution::EdgeLabels> SubgraphCutPerFrame;

        validate(problemGraph, solution);

        SubgraphCutPerFrame subgraphCutPerFrame(problem(), solution.edge_labels);
        ComponentLabeling componentsPerFrame;
        componentsPerFrame.build(problemGraph.graph(), subgraphCutPerFrame);

        // join components c0 (at time t) and c1 (at time t+1) iff
        // c1 is the unique descendant of c0
        for (size_t frame = 0; frame < problemGraph.numberOfFrames() - 1; ++frame)
        {
            std::map<size_t, std::set<size_t>> descendants;
            for (size_t j = 0; j < problemGraph.numberOfNodesInFrame(frame); ++j)
            {
                auto v0 = problemGraph.nodeInFrame(frame, j);
                auto v0Component = componentsPerFrame.partition_.find(v0);
                
                for (auto it = problemGraph.graph().adjacenciesFromVertexBegin(v0);
                    it != problemGraph.graph().adjacenciesFromVertexEnd(v0); ++it)
                {
                    auto v1 = it->vertex();

                    if (problem().nodes[v1].t == frame + 1 && solution.edge_labels[it->edge()] == 0)
                    {
                        auto v1Component = componentsPerFrame.partition_.find(v1);

                        descendants[v0Component].insert(v1Component);
                    }
                }
            }

            for (auto& p: descendants)
                if (p.second.size() == 1)
                {
                    auto v0Component = p.first;
                    auto v1Component = *(p.second.begin());

                    componentsPerFrame.partition_.merge(v0Component, v1Component);
                }
        }

        lineageGraph_.insertVertices(componentsPerFrame.partition_.numberOfSets());
        // from now on, member function numberOfCells works

        componentsPerFrame.partition_.elementLabeling(cellOfNode_.begin());

        nodesOfCell_.resize(numberOfCells());
        for (size_t v = 0; v < numberOfNodes(); ++v)
            nodesOfCell_[cellOfNode_[v]].push_back(v);

        for (size_t frame = 0; frame < problemGraph.numberOfFrames() - 1; ++frame)
            for (size_t j = 0; j < problemGraph.numberOfNodesInFrame(frame); ++j)
            {
                auto v0 = problemGraph.nodeInFrame(frame, j);

                for (auto it = problemGraph.graph().adjacenciesFromVertexBegin(v0);
                    it != problemGraph.graph().adjacenciesFromVertexEnd(v0); ++it)
                {
                    auto v1 = it->vertex();

                    if (problem().nodes[v1].t == frame + 1 && solution.edge_labels[it->edge()] == 0)
                    {
                        auto c0 = cellOfNode_[v0];
                        auto c1 = cellOfNode_[v1];

                        if (c0 != c1)
                            lineageGraph_.insertEdge(c0, c1);
                    }
                }
            }
    }